

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O3

Dec_Edge_t Dec_FactorLF_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  int iVar1;
  Vec_Int_t *vEdgeLits;
  Dec_Edge_t DVar2;
  Dec_Edge_t DVar3;
  int iVar4;
  void *pvVar5;
  Mvc_Cover_t *pDiv;
  Mvc_Cube_t *pCube;
  Dec_Node_t *pDVar6;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *local_40;
  Mvc_Cover_t *local_38;
  
  pvVar5 = Abc_FrameReadManDec();
  vEdgeLits = *(Vec_Int_t **)((long)pvVar5 + 0x10);
  pDiv = Mvc_CoverBestLiteralCover(pCover,pSimple);
  Mvc_CoverDivideByLiteral(pCover,pDiv,&local_38,&local_40);
  pCube = Mvc_CoverReadCubeHead(pDiv);
  DVar2 = Dec_FactorTrivialCube(pFForm,pDiv,pCube,vEdgeLits);
  Mvc_CoverFree(pDiv);
  DVar3 = Dec_Factor_rec(pFForm,local_38);
  Mvc_CoverFree(local_38);
  iVar4 = pFForm->nSize;
  pDVar6 = pFForm->pNodes;
  if (iVar4 == pFForm->nCap) {
    if (pDVar6 == (Dec_Node_t *)0x0) {
      pDVar6 = (Dec_Node_t *)malloc((long)iVar4 * 0x30);
      iVar1 = iVar4;
    }
    else {
      pDVar6 = (Dec_Node_t *)realloc(pDVar6,(long)iVar4 * 0x30);
      iVar4 = pFForm->nSize;
      iVar1 = pFForm->nCap;
    }
    pFForm->pNodes = pDVar6;
    pFForm->nCap = iVar1 * 2;
  }
  pFForm->nSize = iVar4 + 1;
  pDVar6[iVar4].field_2.pFunc = (void *)0x0;
  (&pDVar6[iVar4].field_2)[1].pFunc = (void *)0x0;
  pDVar6[iVar4].eEdge0 = DVar2;
  pDVar6[iVar4].eEdge1 = DVar3;
  *(uint *)&pDVar6[iVar4].field_0x10 = ((uint)DVar3 & 1) << 0x10 | ((uint)DVar2 & 1) << 0xf;
  DVar2 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
  iVar4 = Mvc_CoverReadCubeNum(local_40);
  if (iVar4 == 0) {
    Mvc_CoverFree(local_40);
  }
  else {
    DVar3 = Dec_Factor_rec(pFForm,local_40);
    Mvc_CoverFree(local_40);
    iVar4 = pFForm->nSize;
    pDVar6 = pFForm->pNodes;
    if (iVar4 == pFForm->nCap) {
      if (pDVar6 == (Dec_Node_t *)0x0) {
        pDVar6 = (Dec_Node_t *)malloc((long)iVar4 * 0x30);
        iVar1 = iVar4;
      }
      else {
        pDVar6 = (Dec_Node_t *)realloc(pDVar6,(long)iVar4 * 0x30);
        iVar4 = pFForm->nSize;
        iVar1 = pFForm->nCap;
      }
      pFForm->pNodes = pDVar6;
      pFForm->nCap = iVar1 * 2;
    }
    pFForm->nSize = iVar4 + 1;
    pDVar6[iVar4].field_2.pFunc = (void *)0x0;
    (&pDVar6[iVar4].field_2)[1].pFunc = (void *)0x0;
    *(uint *)&pDVar6[iVar4].field_0x10 = ((uint)DVar3 & 1) << 0x10 | 0x4000;
    pDVar6[iVar4].eEdge0 = (Dec_Edge_t)((uint)DVar2 | 1);
    pDVar6[iVar4].eEdge1 = (Dec_Edge_t)((uint)DVar3 ^ 1);
    DVar2 = (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
  }
  return DVar2;
}

Assistant:

Dec_Edge_t Dec_FactorLF_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Dec_Man_t * pManDec = (Dec_Man_t *)Abc_FrameReadManDec();
    Vec_Int_t * vEdgeLits  = pManDec->vLits;
    Mvc_Cover_t * pDiv, * pQuo, * pRem;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd;

    // get the most often occurring literal
    pDiv = Mvc_CoverBestLiteralCover( pCover, pSimple );
    // divide the cover by the literal
    Mvc_CoverDivideByLiteral( pCover, pDiv, &pQuo, &pRem );
    // get the node pointer for the literal
    eNodeDiv = Dec_FactorTrivialCube( pFForm, pDiv, Mvc_CoverReadCubeHead(pDiv), vEdgeLits );
    Mvc_CoverFree( pDiv );
    // factor the quotient and remainder
    eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
    Mvc_CoverFree( pQuo );
    eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
    if ( Mvc_CoverReadCubeNum(pRem) == 0 )
    {
        Mvc_CoverFree( pRem );
        return eNodeAnd;
    }
    else
    {
        eNodeRem = Dec_Factor_rec( pFForm, pRem );
        Mvc_CoverFree( pRem );
        return Dec_GraphAddNodeOr( pFForm,  eNodeAnd, eNodeRem );
    }
}